

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O3

bool __thiscall
glslang::TInputScanner::scanVersion
          (TInputScanner *this,int *version,EProfile *profile,bool *notFirstToken)

{
  size_t *psVar1;
  int *piVar2;
  int iVar3;
  EProfile EVar4;
  long lVar5;
  long lVar6;
  byte unaff_BL;
  byte bVar7;
  ulong uVar8;
  long lVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  size_t sVar14;
  bool bVar15;
  byte bVar16;
  int iVar17;
  bool foundNonSpaceTab;
  char profileString [13];
  bool local_56;
  short local_55;
  undefined2 uStack_53;
  undefined4 uStack_51;
  undefined5 uStack_4d;
  EProfile *local_48;
  int *local_40;
  bool *local_38;
  
  bVar16 = 0;
  *notFirstToken = false;
  *version = 0;
  *profile = ENoProfile;
  local_56 = false;
  bVar15 = false;
  local_48 = profile;
  local_40 = version;
  local_38 = notFirstToken;
LAB_004c2d5b:
  do {
    do {
      if (bVar15) {
        *local_38 = true;
        iVar3 = this->numSources;
        iVar17 = this->currentSource;
        if (iVar17 < iVar3) {
          lVar6 = (long)iVar17;
          sVar10 = this->currentChar;
          lVar13 = lVar6;
          sVar14 = sVar10;
          do {
            if (sVar14 < this->lengths[lVar13]) {
              if (this->sources[lVar13][sVar14] == '\n') goto LAB_004c2df5;
              break;
            }
            lVar13 = lVar13 + 1;
            sVar14 = 0;
          } while (iVar3 != lVar13);
          do {
            if (sVar10 < this->lengths[lVar6]) {
              if (this->sources[lVar6][sVar10] == '\r') goto LAB_004c2df5;
              break;
            }
            lVar6 = lVar6 + 1;
            sVar10 = 0;
          } while (iVar3 != lVar6);
        }
        else {
          this->endOfFileReached = true;
        }
        do {
          do {
            iVar3 = get(this);
          } while (0xe < iVar3 + 1U);
        } while ((0x4801U >> (iVar3 + 1U & 0x1f) & 1) == 0);
LAB_004c2e68:
        iVar3 = this->numSources;
        iVar17 = this->currentSource;
LAB_004c2df5:
        if (iVar17 < iVar3) {
          psVar1 = this->lengths;
          uVar8 = this->currentChar;
          lVar5 = (long)iVar17;
          lVar6 = (long)iVar3;
          lVar13 = lVar5;
          uVar11 = uVar8;
          do {
            lVar9 = lVar5;
            uVar12 = uVar8;
            if (uVar11 < psVar1[lVar13]) {
              if (this->sources[lVar13][uVar11] == '\n') goto LAB_004c2e60;
              break;
            }
            lVar13 = lVar13 + 1;
            uVar11 = 0;
          } while (lVar6 != lVar13);
          do {
            if (uVar12 < psVar1[lVar9]) goto LAB_004c2e51;
            lVar9 = lVar9 + 1;
            uVar12 = 0;
            if (lVar6 == lVar9) goto LAB_004c2e83;
          } while( true );
        }
        this->endOfFileReached = true;
        goto LAB_004c3090;
      }
LAB_004c2e89:
      consumeWhitespaceComment(this,&local_56);
      bVar7 = bVar16 | local_56;
      iVar3 = get(this);
      bVar15 = true;
      bVar16 = 1;
    } while (iVar3 != 0x23);
    do {
      do {
        iVar3 = get(this);
      } while (iVar3 == 9);
    } while (iVar3 == 0x20);
    if (iVar3 == 0x76) {
      iVar3 = get(this);
      bVar16 = 1;
      if (iVar3 == 0x65) {
        iVar3 = get(this);
        bVar16 = 1;
        if (iVar3 == 0x72) {
          iVar3 = get(this);
          bVar16 = 1;
          if (iVar3 == 0x73) {
            iVar3 = get(this);
            bVar16 = 1;
            if (iVar3 == 0x69) {
              iVar3 = get(this);
              bVar16 = 1;
              if (iVar3 == 0x6f) {
                iVar3 = get(this);
                bVar16 = 1;
                if (iVar3 == 0x6e) {
                  do {
                    do {
                      iVar3 = get(this);
                      piVar2 = local_40;
                    } while (iVar3 == 9);
                  } while (iVar3 == 0x20);
                  while (iVar3 - 0x30U < 10) {
                    *piVar2 = (iVar3 - 0x30U) + *piVar2 * 10;
                    iVar3 = get(this);
                  }
                  bVar16 = 1;
                  if (*piVar2 != 0) {
                    while ((iVar3 == 0x20 || (iVar3 == 9))) {
                      iVar3 = get(this);
                    }
                    lVar13 = 0;
                    do {
                      bVar16 = bVar7;
                      if ((iVar3 + 1U < 0x22) &&
                         ((0x200004c01U >> ((ulong)(iVar3 + 1U) & 0x3f) & 1) != 0)) {
                        iVar17 = (int)lVar13;
                        if (iVar17 == 0xd) goto LAB_004c301f;
                        if (iVar17 == 4) {
                          unaff_BL = bVar7;
                          if (CONCAT22(uStack_53,local_55) != 0x65726f63) goto LAB_004c306a;
                          EVar4 = ECoreProfile;
                        }
                        else {
                          unaff_BL = bVar7;
                          if ((iVar17 != 2) || (local_55 != 0x7365)) goto LAB_004c306a;
                          EVar4 = EEsProfile;
                        }
                        goto LAB_004c305e;
                      }
                      *(char *)((long)&local_55 + lVar13) = (char)iVar3;
                      iVar3 = get(this);
                      lVar13 = lVar13 + 1;
                    } while (lVar13 != 0xd);
                    bVar16 = 1;
                    if ((iVar3 + 1U < 0x22) &&
                       ((0x200004c01U >> ((ulong)(iVar3 + 1U) & 0x3f) & 1) != 0)) {
LAB_004c301f:
                      bVar16 = bVar7;
                      unaff_BL = bVar7;
                      if (CONCAT53(uStack_4d,uStack_51._1_3_) == 0x7974696c69626974 &&
                          CONCAT44(uStack_51,CONCAT22(uStack_53,local_55)) == 0x62697461706d6f63) {
                        EVar4 = ECompatibilityProfile;
LAB_004c305e:
                        *local_48 = EVar4;
                        bVar16 = bVar7;
                        unaff_BL = bVar7;
                      }
                    }
LAB_004c306a:
                    if ((iVar3 + 1U < 0x22) &&
                       ((0x200004c01U >> ((ulong)(iVar3 + 1U) & 0x3f) & 1) != 0)) {
LAB_004c3092:
                      return (bool)(unaff_BL & 1);
                    }
                  }
                }
              }
            }
          }
        }
      }
      goto LAB_004c2d5b;
    }
    bVar16 = 1;
  } while( true );
LAB_004c2e51:
  if (this->sources[lVar9][uVar12] != '\r') goto LAB_004c2e83;
LAB_004c2e60:
  get(this);
  goto LAB_004c2e68;
LAB_004c2e83:
  if (uVar8 < psVar1[lVar5]) goto LAB_004c2e89;
  lVar5 = lVar5 + 1;
  uVar8 = 0;
  if (lVar6 == lVar5) goto LAB_004c3090;
  goto LAB_004c2e83;
LAB_004c3090:
  unaff_BL = 1;
  goto LAB_004c3092;
}

Assistant:

bool TInputScanner::scanVersion(int& version, EProfile& profile, bool& notFirstToken)
{
    // This function doesn't have to get all the semantics correct,
    // just find the #version if there is a correct one present.
    // The preprocessor will have the responsibility of getting all the semantics right.

    bool versionNotFirst = false;  // means not first WRT comments and white space, nothing more
    notFirstToken = false;         // means not first WRT to real tokens
    version = 0;                   // means not found
    profile = ENoProfile;

    bool foundNonSpaceTab = false;
    bool lookingInMiddle = false;
    int c;
    do {
        if (lookingInMiddle) {
            notFirstToken = true;
            // make forward progress by finishing off the current line plus extra new lines
            if (peek() != '\n' && peek() != '\r') {
                do {
                    c = get();
                } while (c != EndOfInput && c != '\n' && c != '\r');
            }
            while (peek() == '\n' || peek() == '\r')
                get();
            if (peek() == EndOfInput)
                return true;
        }
        lookingInMiddle = true;

        // Nominal start, skipping the desktop allowed comments and white space, but tracking if
        // something else was found for ES:
        consumeWhitespaceComment(foundNonSpaceTab);
        if (foundNonSpaceTab)
            versionNotFirst = true;

        // "#"
        if (get() != '#') {
            versionNotFirst = true;
            continue;
        }

        // whitespace
        do {
            c = get();
        } while (c == ' ' || c == '\t');

        // "version"
        if (    c != 'v' ||
            get() != 'e' ||
            get() != 'r' ||
            get() != 's' ||
            get() != 'i' ||
            get() != 'o' ||
            get() != 'n') {
            versionNotFirst = true;
            continue;
        }

        // whitespace
        do {
            c = get();
        } while (c == ' ' || c == '\t');

        // version number
        while (c >= '0' && c <= '9') {
            version = 10 * version + (c - '0');
            c = get();
        }
        if (version == 0) {
            versionNotFirst = true;
            continue;
        }

        // whitespace
        while (c == ' ' || c == '\t')
            c = get();

        // profile
        const int maxProfileLength = 13;  // not including any 0
        char profileString[maxProfileLength];
        int profileLength;
        for (profileLength = 0; profileLength < maxProfileLength; ++profileLength) {
            if (c == EndOfInput || c == ' ' || c == '\t' || c == '\n' || c == '\r')
                break;
            profileString[profileLength] = (char)c;
            c = get();
        }
        if (c != EndOfInput && c != ' ' && c != '\t' && c != '\n' && c != '\r') {
            versionNotFirst = true;
            continue;
        }

        if (profileLength == 2 && strncmp(profileString, "es", profileLength) == 0)
            profile = EEsProfile;
        else if (profileLength == 4 && strncmp(profileString, "core", profileLength) == 0)
            profile = ECoreProfile;
        else if (profileLength == 13 && strncmp(profileString, "compatibility", profileLength) == 0)
            profile = ECompatibilityProfile;

        return versionNotFirst;
    } while (true);
}